

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrIncr.c
# Opt level: O0

int IPdr_ManCheckClauses(Pdr_Man_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *p_00;
  Pdr_Set_t *pCube;
  int counter;
  int iStartFrame;
  int kMax;
  int RetValue;
  int k;
  int j;
  Vec_Ptr_t *vArrayK;
  Pdr_Set_t *pCubeK;
  Pdr_Man_t *p_local;
  
  iVar1 = Vec_PtrSize(p->vSolvers);
  kMax = 1;
  do {
    if (iVar1 <= kMax) {
      return 1;
    }
    p_00 = Vec_VecEntry(p->vClauses,kMax);
    for (RetValue = 0; iVar2 = Vec_PtrSize(p_00), RetValue < iVar2; RetValue = RetValue + 1) {
      pCube = (Pdr_Set_t *)Vec_PtrEntry(p_00,RetValue);
      iVar2 = Pdr_ManCheckCube(p,kMax + -1,pCube,(Pdr_Set_t **)0x0,0,0,1);
      if (iVar2 == 0) {
        printf("Cube[%d][%d] not inductive!\n",(ulong)(uint)kMax,(ulong)(uint)RetValue);
      }
      if (iVar2 == -1) {
        return -1;
      }
    }
    kMax = kMax + 1;
  } while( true );
}

Assistant:

int IPdr_ManCheckClauses( Pdr_Man_t * p )
{
    Pdr_Set_t * pCubeK;
    Vec_Ptr_t * vArrayK;
    int j, k, RetValue, kMax = Vec_PtrSize(p->vSolvers);
    int iStartFrame = 1;
    int counter = 0;

    Vec_VecForEachLevelStartStop( p->vClauses, vArrayK, k, iStartFrame, kMax )
    {
        Vec_PtrForEachEntry( Pdr_Set_t *, vArrayK, pCubeK, j )
        {
            ++counter;
            RetValue = Pdr_ManCheckCube( p, k - 1, pCubeK, NULL, 0, 0, 1 );

            if ( !RetValue ) {
                printf( "Cube[%d][%d] not inductive!\n", k, j );
            }

            if ( RetValue == -1 )
                return -1;
        }
    }

    return 1;
}